

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DMDetector.cpp
# Opt level: O3

bool __thiscall
ZXing::DataMatrix::EdgeTracer::traceLine(EdgeTracer *this,PointF dEdge,RegressionLine *line)

{
  BitMatrix *pBVar1;
  ByteMatrix *pBVar2;
  pointer pcVar3;
  bool bVar4;
  uint uVar5;
  Value VVar6;
  ulong uVar7;
  int iVar8;
  uint uVar9;
  int iVar10;
  double dVar11;
  double dVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  PointT<double> p;
  PointF PVar19;
  PointT<double> p_00;
  PointT<double> p_01;
  undefined1 local_68 [16];
  double local_58;
  double dStack_50;
  
  dVar12 = dEdge.y;
  dVar11 = dEdge.x;
  auVar17._8_8_ = 0;
  auVar17._0_8_ = dVar11;
  auVar14._8_8_ = 0;
  auVar14._0_8_ = dVar12;
  auVar15._0_8_ = SQRT(dVar11 * dVar11 + dVar12 * dVar12);
  auVar15._8_8_ = auVar15._0_8_;
  PVar19 = (PointF)divpd((undefined1  [16])dEdge,auVar15);
  line->_directionInward = PVar19;
  uVar5 = (uint)(ABS(dVar12) < ABS(dVar11));
  auVar13._0_4_ = (int)(uVar5 << 0x1f) >> 0x1f;
  auVar13._4_4_ = (int)(uVar5 << 0x1f) >> 0x1f;
  auVar13._8_4_ = (int)(uVar5 << 0x1f) >> 0x1f;
  auVar13._12_4_ = (int)(uVar5 << 0x1f) >> 0x1f;
  auVar14 = ~auVar13 & auVar14 << 0x40 | auVar17 & auVar13;
  do {
    PVar19.x = (this->super_BitMatrixCursorF).p.x;
    PVar19.y = (this->super_BitMatrixCursorF).p.y;
    RegressionLine::add(line,PVar19);
    uVar7 = ((long)(line->_points).
                   super__Vector_base<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(line->_points).
                   super__Vector_base<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 4) * -0x70a3d70a3d70a3d7 +
            0x6666666666666666;
    if ((uVar7 >> 1 | (ulong)((uVar7 & 1) != 0) << 0x3f) < 0x51eb851eb851eb9) {
      PVar19 = RegressionLine::centroid(line);
      bVar4 = updateDirectionFromOrigin(this,PVar19);
      if (!bVar4) {
        return false;
      }
    }
    iVar8 = 1;
    iVar10 = 3;
LAB_001530c2:
    uVar7 = 0;
    do {
      if (iVar10 == (int)uVar7) goto LAB_00153128;
      uVar9 = (int)uVar7 + 1;
      uVar5 = -(int)(uVar7 >> 1);
      if ((uVar7 & 1) != 0) {
        uVar5 = uVar9 >> 1;
      }
      local_58 = auVar14._0_8_;
      dStack_50 = auVar14._8_8_;
      p.x = (double)(int)uVar5 * local_58 +
            (this->super_BitMatrixCursorF).d.x + (this->super_BitMatrixCursorF).p.x;
      p.y = (double)(int)uVar5 * dStack_50 +
            (this->super_BitMatrixCursorF).d.y + (this->super_BitMatrixCursorF).p.y;
      p_00.x = local_58 + p.x;
      p_00.y = dStack_50 + p.y;
      VVar6 = BitMatrixCursor<ZXing::PointT<double>_>::testAt<double>
                        (&this->super_BitMatrixCursorF,p_00);
      uVar7 = (ulong)uVar9;
    } while (VVar6.v != 1);
    iVar8 = 3;
    while( true ) {
      local_68._0_8_ = p.x;
      if ((double)local_68._0_8_ < 0.0) {
        return false;
      }
      pBVar1 = (this->super_BitMatrixCursorF).img;
      if ((double)pBVar1->_width <= (double)local_68._0_8_) {
        return false;
      }
      local_68._8_8_ = p.y;
      if ((double)local_68._8_8_ < 0.0) {
        return false;
      }
      if ((double)pBVar1->_height <= (double)local_68._8_8_) {
        return false;
      }
      VVar6 = BitMatrixCursor<ZXing::PointT<double>_>::testAt<double>
                        (&this->super_BitMatrixCursorF,p);
      if (VVar6.v == 0) break;
      local_68._0_8_ = (double)local_68._0_8_ - local_58;
      local_68._8_8_ = (double)local_68._8_8_ - dStack_50;
      p_01.x = (double)local_68._0_8_ - (this->super_BitMatrixCursorF).d.x;
      p_01.y = (double)local_68._8_8_ - (this->super_BitMatrixCursorF).d.y;
      VVar6 = BitMatrixCursor<ZXing::PointT<double>_>::testAt<double>
                        (&this->super_BitMatrixCursorF,p_01);
      uVar5 = (uint)(VVar6.v == 1);
      auVar16._0_8_ = CONCAT44((int)(uVar5 << 0x1f) >> 0x1f,(int)(uVar5 << 0x1f) >> 0x1f);
      auVar16._8_4_ = (int)(uVar5 << 0x1f) >> 0x1f;
      auVar16._12_4_ = (int)(uVar5 << 0x1f) >> 0x1f;
      auVar18._0_8_ =
           (ulong)((double)local_68._0_8_ - (this->super_BitMatrixCursorF).d.x) & auVar16._0_8_;
      auVar18._8_8_ =
           (ulong)((double)local_68._8_8_ - (this->super_BitMatrixCursorF).d.y) & auVar16._8_8_;
      p = (PointT<double>)(auVar18 | ~auVar16 & local_68);
      iVar8 = iVar8 + -1;
      if (iVar8 == 0) {
        return false;
      }
    }
    dVar11 = floor((double)local_68._0_8_);
    dVar12 = floor((double)local_68._8_8_);
    (this->super_BitMatrixCursorF).p.x = dVar11 + 0.5;
    (this->super_BitMatrixCursorF).p.y = dVar12 + 0.5;
    pBVar2 = this->history;
    if (pBVar2 != (ByteMatrix *)0x0) {
      iVar8 = (int)(dVar12 + 0.5) * (pBVar2->super_Matrix<signed_char>)._width + (int)(dVar11 + 0.5)
      ;
      pcVar3 = (pBVar2->super_Matrix<signed_char>)._data.
               super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
               super__Vector_impl_data._M_start;
      if (this->state == (int)pcVar3[iVar8]) {
        return false;
      }
      pcVar3[iVar8] = (char)this->state;
    }
  } while( true );
LAB_00153128:
  iVar8 = iVar8 + 1;
  iVar10 = iVar10 + 2;
  if (iVar8 == 3) {
    if ((ulong)((long)(line->_points).
                      super__Vector_base<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
               (long)(line->_points).
                     super__Vector_base<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_>
                     ._M_impl.super__Vector_impl_data._M_start) < 0x11) {
      return false;
    }
    PVar19 = RegressionLine::centroid(line);
    bVar4 = updateDirectionFromOrigin(this,PVar19);
    return bVar4;
  }
  goto LAB_001530c2;
}

Assistant:

bool traceLine(PointF dEdge, RegressionLine& line)
	{
		line.setDirectionInward(dEdge);
		do {
			log(p);
			line.add(p);
			if (line.points().size() % 50 == 10 && !updateDirectionFromLineCentroid(line))
				return false;
			auto stepResult = traceStep(dEdge, 1, line.isValid());
			if (stepResult != StepResult::FOUND)
				return stepResult == StepResult::OPEN_END && line.points().size() > 1 && updateDirectionFromLineCentroid(line);
		} while (true);
	}